

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer_cast_operator.hpp
# Opt level: O3

bool __thiscall
duckdb::
IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
          (duckdb *this,char *buf,idx_t len,IntegerCastData<short> *result,bool strict)

{
  duckdb dVar1;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar7 = (char *)(ulong)(*this == (duckdb)0x2b);
  pcVar5 = pcVar7;
  if (pcVar7 < buf) {
    uVar6 = (uint)*(ushort *)len;
    pcVar4 = pcVar7;
    do {
      dVar1 = this[(long)pcVar4];
      bVar3 = (char)dVar1 - 0x30;
      if (9 < bVar3) {
        if (dVar1 == (duckdb)0x2c) {
          pcVar5 = pcVar4 + 1;
          if (buf <= pcVar5) {
            if (pcVar4 <= pcVar7) {
              return false;
            }
            break;
          }
          bVar2 = pcVar4 <= pcVar7;
          dVar1 = (this + 1)[(long)pcVar4];
          pcVar4 = pcVar5;
          if ((byte)((char)dVar1 - 0x30U) < 10 || bVar2) {
            return false;
          }
        }
        if (0x20 < (byte)dVar1) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)dVar1 & 0x3f) & 1) == 0) {
          return false;
        }
        pcVar4 = pcVar4 + 1;
        pcVar5 = pcVar4;
        if (pcVar4 < buf) {
          do {
            if ((0x20 < (ulong)(byte)this[(long)pcVar4]) ||
               ((0x100003e00U >> ((ulong)(byte)this[(long)pcVar4] & 0x3f) & 1) == 0)) {
              return false;
            }
            pcVar4 = pcVar4 + 1;
            pcVar5 = buf;
          } while (buf != pcVar4);
        }
        break;
      }
      if ((short)((bVar3 ^ 0x7ffe) / 10) < (short)uVar6) {
        return false;
      }
      pcVar8 = pcVar4 + 1;
      uVar6 = (uint)bVar3 + uVar6 * 10;
      *(short *)len = (short)uVar6;
      pcVar5 = buf;
      if (pcVar8 == buf) break;
      if (this[(long)pcVar8] == (duckdb)0x5f) {
        pcVar8 = pcVar4 + 2;
        if (pcVar8 == buf) {
          return false;
        }
        if (9 < (byte)((char)this[(long)pcVar8] - 0x30U)) {
          return false;
        }
      }
      pcVar5 = pcVar8;
      pcVar4 = pcVar8;
    } while (pcVar8 < buf);
  }
  return pcVar7 < pcVar5;
}

Assistant:

static bool IntegerCastLoop(const char *buf, idx_t len, T &result, bool strict) {
	idx_t start_pos;
	if (NEGATIVE) {
		start_pos = 1;
	} else {
		if (*buf == '+') {
			if (strict) {
				// leading plus is not allowed in strict mode
				return false;
			}
			start_pos = 1;
		} else {
			start_pos = 0;
		}
	}
	idx_t pos = start_pos;
	while (pos < len) {
		if (!StringUtil::CharacterIsDigit(buf[pos])) {
			// not a digit!
			if (buf[pos] == decimal_separator) {
				if (strict) {
					return false;
				}
				bool number_before_period = pos > start_pos;
				// decimal point: we accept decimal values for integers as well
				// we just truncate them
				// make sure everything after the period is a number
				pos++;
				idx_t start_digit = pos;
				while (pos < len) {
					if (!StringUtil::CharacterIsDigit(buf[pos])) {
						break;
					}
					if (!OP::template HandleDecimal<T, NEGATIVE, ALLOW_EXPONENT>(
					        result, UnsafeNumericCast<uint8_t>(buf[pos] - '0'))) {
						return false;
					}
					pos++;

					if (pos != len && buf[pos] == '_') {
						// Skip one underscore if it is not the last character and followed by a digit
						pos++;
						if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
							return false;
						}
					}
				}
				// make sure there is either (1) one number after the period, or (2) one number before the period
				// i.e. we accept "1." and ".1" as valid numbers, but not "."
				if (!(number_before_period || pos > start_digit)) {
					return false;
				}
				if (pos >= len) {
					break;
				}
			}
			if (StringUtil::CharacterIsSpace(buf[pos])) {
				// skip any trailing spaces
				while (++pos < len) {
					if (!StringUtil::CharacterIsSpace(buf[pos])) {
						return false;
					}
				}
				break;
			}
			if (ALLOW_EXPONENT) {
				if (buf[pos] == 'e' || buf[pos] == 'E') {
					if (strict) {
						return false;
					}
					if (pos == start_pos) {
						return false;
					}
					pos++;
					if (pos >= len) {
						return false;
					}
					using ExponentData = IntegerCastData<int16_t>;
					ExponentData exponent {};
					int negative = buf[pos] == '-';
					if (negative) {
						if (!IntegerCastLoop<ExponentData, true, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					} else {
						if (!IntegerCastLoop<ExponentData, false, false, IntegerCastOperation, decimal_separator>(
						        buf + pos, len - pos, exponent, strict)) {
							return false;
						}
					}
					return OP::template HandleExponent<T, NEGATIVE>(result, exponent.result);
				}
			}
			return false;
		}
		auto digit = UnsafeNumericCast<uint8_t>(buf[pos++] - '0');
		if (!OP::template HandleDigit<T, NEGATIVE>(result, digit)) {
			return false;
		}

		if (pos != len && buf[pos] == '_' && !strict) {
			// Skip one underscore if it is not the last character and followed by a digit
			pos++;
			if (pos == len || !StringUtil::CharacterIsDigit(buf[pos])) {
				return false;
			}
		}
	}
	if (!OP::template Finalize<T, NEGATIVE>(result)) {
		return false;
	}
	return pos > start_pos;
}